

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O0

int pt_time_ctc_fc(uint64_t *fc,uint64_t ctc,pt_config *config)

{
  uint32_t ebx;
  uint32_t eax;
  pt_config *config_local;
  uint64_t ctc_local;
  uint64_t *fc_local;
  
  if ((fc == (uint64_t *)0x0) || (config == (pt_config *)0x0)) {
    fc_local._4_4_ = -1;
  }
  else if ((config->cpuid_0x15_eax == 0) || (config->cpuid_0x15_ebx == 0)) {
    fc_local._4_4_ = -10;
  }
  else {
    *fc = (ctc * config->cpuid_0x15_ebx) / (ulong)config->cpuid_0x15_eax;
    fc_local._4_4_ = 0;
  }
  return fc_local._4_4_;
}

Assistant:

static int pt_time_ctc_fc(uint64_t *fc, uint64_t ctc,
			  const struct pt_config *config)
{
	uint32_t eax, ebx;

	if (!fc || !config)
		return -pte_internal;

	eax = config->cpuid_0x15_eax;
	ebx = config->cpuid_0x15_ebx;

	/* Neither multiply nor divide by zero. */
	if (!eax || !ebx)
		return -pte_bad_config;

	*fc = (ctc * ebx) / eax;
	return 0;
}